

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O2

Value * __thiscall
ot::commissioner::Interpreter::ProcessStart
          (Value *__return_storage_ptr__,Interpreter *this,Expression *aExpr)

{
  char cVar1;
  ErrorCode EVar2;
  Status SVar3;
  long lVar4;
  char *pcVar5;
  Value *pVVar6;
  char *pcVar7;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  string *psVar8;
  string_view fmt;
  string_view fmt_00;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  BorderRouterId rawid;
  string local_428;
  writer write;
  undefined1 local_400 [72];
  CommissionerAppPtr commissioner;
  NetworkSelectionComparator guard;
  Expression expr;
  format_string_checker<char> local_378;
  undefined1 local_348 [40];
  undefined1 local_320 [40];
  undefined1 local_2f8 [40];
  undefined1 local_2d0 [40];
  undefined1 local_2a8 [40];
  undefined1 local_280 [40];
  undefined1 local_258 [40];
  undefined1 local_230 [40];
  undefined1 local_208 [40];
  undefined1 local_1e0 [40];
  BorderRouter br;
  
  (__return_storage_ptr__->mError).mCode = kNone;
  (__return_storage_ptr__->mError).mMessage._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mError).mMessage.field_2;
  (__return_storage_ptr__->mError).mMessage._M_string_length = 0;
  (__return_storage_ptr__->mError).mMessage.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->mData)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mData).field_2;
  (__return_storage_ptr__->mData)._M_string_length = 0;
  (__return_storage_ptr__->mData).field_2._M_local_buf[0] = '\0';
  commissioner.super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  commissioner.super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&expr,aExpr);
  persistent_storage::BorderRouter::BorderRouter(&br);
  lVar4 = (long)(aExpr->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(aExpr->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start >> 5;
  if (lVar4 == 1) {
    SVar3 = persistent_storage::Registry::GetCurrentNetworkXpan
                      ((this->mRegistry).
                       super___shared_ptr<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr,(uint64_t *)&guard);
    if (SVar3 == kSuccess) {
      JobManager::GetSelectedCommissioner
                ((Error *)local_2a8,
                 (this->mJobManager).
                 super___shared_ptr<ot::commissioner::JobManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                 ,&commissioner);
      Value::Value((Value *)local_400,(Error *)local_2a8);
      pVVar6 = Value::operator=(__return_storage_ptr__,(Value *)local_400);
      EVar2 = (pVVar6->mError).mCode;
      Value::~Value((Value *)local_400);
      std::__cxx11::string::~string((string *)(local_2a8 + 8));
      if (EVar2 != kNone) goto LAB_0018be92;
      JobManager::MakeBorderRouterChoice
                ((Error *)local_2d0,
                 (this->mJobManager).
                 super___shared_ptr<ot::commissioner::JobManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                 ,(uint64_t)guard.mInterpreter,&br);
      Value::Value((Value *)local_400,(Error *)local_2d0);
      pVVar6 = Value::operator=(__return_storage_ptr__,(Value *)local_400);
      EVar2 = (pVVar6->mError).mCode;
      Value::~Value((Value *)local_400);
      std::__cxx11::string::~string((string *)(local_2d0 + 8));
      if (EVar2 != kNone) goto LAB_0018be92;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&expr,&br.mAgent.mAddr);
      std::__cxx11::to_string((string *)local_400,(uint)br.mAgent.mPort);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&expr,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_400);
      std::__cxx11::string::~string((string *)local_400);
LAB_0018bcae:
      ProcessStartJob((Value *)local_400,this,&commissioner,&expr);
      Value::operator=(__return_storage_ptr__,(Value *)local_400);
      Value::~Value((Value *)local_400);
      goto LAB_0018be92;
    }
    local_378._0_8_ = local_378._0_8_ & 0xffffffff00000000;
    local_378.context_.super_basic_format_parse_context<char>.format_str_.data_ =
         "getting selected network failed";
    local_378.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x1f;
    local_378.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
    local_378.context_.super_basic_format_parse_context<char>._20_4_ = 0;
    local_378.parse_funcs_[0] = (parse_func)0x0;
    pcVar5 = "getting selected network failed";
    local_378.context_.types_ = local_378.types_;
    while (pcVar7 = pcVar5, pcVar7 != "") {
      pcVar5 = pcVar7 + 1;
      if (*pcVar7 == '}') {
        if ((pcVar5 == "") || (*pcVar5 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar5 = pcVar7 + 2;
      }
      else if (*pcVar7 == '{') {
        pcVar5 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (pcVar7,"",&local_378);
      }
    }
    args_00.field_1.values_ = in_R9.values_;
    args_00.desc_ = (unsigned_long_long)&local_378;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_428,(v10 *)"getting selected network failed",(string_view)ZEXT816(0x1f),
               args_00);
    psVar8 = (string *)(local_1e0 + 8);
    local_1e0._0_4_ = kRegistryError;
    std::__cxx11::string::string(psVar8,(string *)&local_428);
    Value::Value((Value *)local_400,(Error *)local_1e0);
LAB_0018ba8a:
    Value::operator=(__return_storage_ptr__,(Value *)local_400);
    Value::~Value((Value *)local_400);
    std::__cxx11::string::~string(psVar8);
    std::__cxx11::string::~string((string *)&local_428);
  }
  else {
    if (lVar4 == 2) {
      persistent_storage::BorderRouterId::BorderRouterId(&rawid);
      NetworkSelectionComparator::NetworkSelectionComparator(&guard,this);
      utils::ParseInteger<unsigned_int>
                ((Error *)local_2f8,&rawid.mId,
                 expr.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + 1);
      Value::Value((Value *)local_400,(Error *)local_2f8);
      pVVar6 = Value::operator=(__return_storage_ptr__,(Value *)local_400);
      EVar2 = (pVVar6->mError).mCode;
      Value::~Value((Value *)local_400);
      std::__cxx11::string::~string((string *)(local_2f8 + 8));
      if (EVar2 == kNone) {
        SVar3 = persistent_storage::Registry::GetBorderRouter
                          ((this->mRegistry).
                           super___shared_ptr<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr,rawid,&br);
        if (SVar3 == kSuccess) {
          SVar3 = persistent_storage::Registry::SetCurrentNetwork
                            ((this->mRegistry).
                             super___shared_ptr<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr,&br);
          if (SVar3 == kSuccess) {
            UpdateNetworkSelectionInfo((Error *)local_400,this,false);
            std::__cxx11::string::~string((string *)(local_400 + 8));
            if (local_400._0_4_ == kNone) {
              JobManager::GetSelectedCommissioner
                        ((Error *)local_320,
                         (this->mJobManager).
                         super___shared_ptr<ot::commissioner::JobManager,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr,&commissioner);
              Value::Value((Value *)local_400,(Error *)local_320);
              pVVar6 = Value::operator=(__return_storage_ptr__,(Value *)local_400);
              EVar2 = (pVVar6->mError).mCode;
              Value::~Value((Value *)local_400);
              std::__cxx11::string::~string((string *)(local_320 + 8));
              if (EVar2 == kNone) {
                expr.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish =
                     expr.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish + -1;
                std::__cxx11::string::~string
                          ((string *)
                           expr.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back(&expr,&br.mAgent.mAddr);
                std::__cxx11::to_string((string *)local_400,(uint)br.mAgent.mPort);
                std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                emplace_back<std::__cxx11::string>
                          ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           &expr,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_400);
                std::__cxx11::string::~string((string *)local_400);
                goto LAB_0018bca1;
              }
            }
            goto LAB_0018be85;
          }
          local_378.types_[0] = uint_type;
          local_378.context_.super_basic_format_parse_context<char>.format_str_.data_ =
               "network selection failed for nwk[{}]";
          local_378.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x24;
          local_378.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
          local_378.context_.super_basic_format_parse_context<char>._20_4_ = 1;
          local_378.parse_funcs_[0] =
               ::fmt::v10::detail::
               parse_format_specs<unsigned_int,fmt::v10::detail::compile_parse_context<char>>;
          pcVar5 = "network selection failed for nwk[{}]";
          write.handler_ = &local_378;
          local_378.context_.types_ = local_378.types_;
          while (pcVar5 != "") {
            cVar1 = *pcVar5;
            pcVar7 = pcVar5;
            while (cVar1 != '{') {
              pcVar7 = pcVar7 + 1;
              if (pcVar7 == "") {
                ::fmt::v10::detail::
                parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_unsigned_int>_>
                ::writer::operator()((writer *)&write,pcVar5,"");
                goto LAB_0018be03;
              }
              cVar1 = *pcVar7;
            }
            ::fmt::v10::detail::
            parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_unsigned_int>_>
            ::writer::operator()((writer *)&write,pcVar5,pcVar7);
            pcVar5 = ::fmt::v10::detail::
                     parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,unsigned_int>&>
                               (pcVar7,"",&local_378);
          }
LAB_0018be03:
          local_378._0_8_ = ZEXT48(br.mNetworkId.mId);
          fmt_00.size_ = 2;
          fmt_00.data_ = (char *)0x24;
          args_03.field_1.args_ = in_R9.args_;
          args_03.desc_ = (unsigned_long_long)&local_378;
          ::fmt::v10::vformat_abi_cxx11_
                    (&local_428,(v10 *)"network selection failed for nwk[{}]",fmt_00,args_03);
          psVar8 = (string *)(local_230 + 8);
          local_230._0_4_ = kNotFound;
          std::__cxx11::string::string(psVar8,(string *)&local_428);
          Value::Value((Value *)local_400,(Error *)local_230);
        }
        else {
          local_378.types_[0] = uint_type;
          local_378.context_.super_basic_format_parse_context<char>.format_str_.data_ =
               "br[{}] not found";
          local_378.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x10;
          local_378.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
          local_378.context_.super_basic_format_parse_context<char>._20_4_ = 1;
          local_378.parse_funcs_[0] =
               ::fmt::v10::detail::
               parse_format_specs<unsigned_int,fmt::v10::detail::compile_parse_context<char>>;
          pcVar5 = "br[{}] not found";
          local_378.context_.types_ = local_378.types_;
          while (pcVar7 = pcVar5, pcVar7 != "") {
            pcVar5 = pcVar7 + 1;
            if (*pcVar7 == '}') {
              if ((pcVar5 == "") || (*pcVar5 != '}')) {
                ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
              }
              pcVar5 = pcVar7 + 2;
            }
            else if (*pcVar7 == '{') {
              pcVar5 = ::fmt::v10::detail::
                       parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,unsigned_int>&>
                                 (pcVar7,"",&local_378);
            }
          }
          local_378._0_8_ = ZEXT48(rawid.mId);
          fmt.size_ = 2;
          fmt.data_ = (char *)0x10;
          args_02.field_1.values_ = in_R9.values_;
          args_02.desc_ = (unsigned_long_long)&local_378;
          ::fmt::v10::vformat_abi_cxx11_(&local_428,(v10 *)"br[{}] not found",fmt,args_02);
          psVar8 = (string *)(local_208 + 8);
          local_208._0_4_ = kNotFound;
          std::__cxx11::string::string(psVar8,(string *)&local_428);
          Value::Value((Value *)local_400,(Error *)local_208);
        }
LAB_0018be5b:
        Value::operator=(__return_storage_ptr__,(Value *)local_400);
        Value::~Value((Value *)local_400);
        std::__cxx11::string::~string(psVar8);
        std::__cxx11::string::~string((string *)&local_428);
      }
    }
    else {
      if (lVar4 != 3) {
        local_378._0_8_ = local_378._0_8_ & 0xffffffff00000000;
        local_378.context_.super_basic_format_parse_context<char>.format_str_.data_ =
             "too many arguments";
        local_378.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x12;
        local_378.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
        local_378.context_.super_basic_format_parse_context<char>._20_4_ = 0;
        local_378.parse_funcs_[0] = (parse_func)0x0;
        pcVar5 = "too many arguments";
        local_378.context_.types_ = local_378.types_;
        while (pcVar7 = pcVar5, pcVar7 != "") {
          pcVar5 = pcVar7 + 1;
          if (*pcVar7 == '}') {
            if ((pcVar5 == "") || (*pcVar5 != '}')) {
              ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
            }
            pcVar5 = pcVar7 + 2;
          }
          else if (*pcVar7 == '{') {
            pcVar5 = ::fmt::v10::detail::
                     parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                               (pcVar7,"",&local_378);
          }
        }
        args.field_1.values_ = in_R9.values_;
        args.desc_ = (unsigned_long_long)&local_378;
        ::fmt::v10::vformat_abi_cxx11_
                  (&local_428,(v10 *)"too many arguments",(string_view)ZEXT816(0x12),args);
        psVar8 = (string *)(local_280 + 8);
        local_280._0_4_ = kInvalidCommand;
        std::__cxx11::string::string(psVar8,(string *)&local_428);
        Value::Value((Value *)local_400,(Error *)local_280);
        goto LAB_0018ba8a;
      }
      NetworkSelectionComparator::NetworkSelectionComparator(&guard,this);
      SVar3 = persistent_storage::Registry::ForgetCurrentNetwork
                        ((this->mRegistry).
                         super___shared_ptr<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr);
      if (SVar3 != kSuccess) {
        local_378._0_8_ = local_378._0_8_ & 0xffffffff00000000;
        local_378.context_.super_basic_format_parse_context<char>.format_str_.data_ =
             "failed to drop network selection";
        local_378.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x20;
        local_378.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
        local_378.context_.super_basic_format_parse_context<char>._20_4_ = 0;
        local_378.parse_funcs_[0] = (parse_func)0x0;
        pcVar5 = "failed to drop network selection";
        write.handler_ = &local_378;
        local_378.context_.types_ = local_378.types_;
        while (pcVar5 != "") {
          cVar1 = *pcVar5;
          pcVar7 = pcVar5;
          while (cVar1 != '{') {
            pcVar7 = pcVar7 + 1;
            if (pcVar7 == "") {
              ::fmt::v10::detail::
              parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::
              writer::operator()(&write,pcVar5,"");
              goto LAB_0018bacd;
            }
            cVar1 = *pcVar7;
          }
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
          operator()(&write,pcVar5,pcVar7);
          pcVar5 = ::fmt::v10::detail::
                   parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                             (pcVar7,"",&local_378);
        }
LAB_0018bacd:
        args_01.field_1.args_ = in_R9.args_;
        args_01.desc_ = (unsigned_long_long)&local_378;
        ::fmt::v10::vformat_abi_cxx11_
                  (&local_428,(v10 *)"failed to drop network selection",(string_view)ZEXT816(0x20),
                   args_01);
        psVar8 = (string *)(local_258 + 8);
        local_258._0_4_ = kRegistryError;
        std::__cxx11::string::string(psVar8,(string *)&local_428);
        Value::Value((Value *)local_400,(Error *)local_258);
        goto LAB_0018be5b;
      }
      UpdateNetworkSelectionInfo((Error *)local_400,this,false);
      std::__cxx11::string::~string((string *)(local_400 + 8));
      if (local_400._0_4_ == kNone) {
        JobManager::GetSelectedCommissioner
                  ((Error *)local_348,
                   (this->mJobManager).
                   super___shared_ptr<ot::commissioner::JobManager,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr,&commissioner);
        Value::Value((Value *)local_400,(Error *)local_348);
        pVVar6 = Value::operator=(__return_storage_ptr__,(Value *)local_400);
        EVar2 = (pVVar6->mError).mCode;
        Value::~Value((Value *)local_400);
        std::__cxx11::string::~string((string *)(local_348 + 8));
        if (EVar2 == kNone) {
LAB_0018bca1:
          NetworkSelectionComparator::~NetworkSelectionComparator(&guard);
          goto LAB_0018bcae;
        }
      }
    }
LAB_0018be85:
    NetworkSelectionComparator::~NetworkSelectionComparator(&guard);
  }
LAB_0018be92:
  persistent_storage::BorderRouter::~BorderRouter(&br);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&expr);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&commissioner.
              super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return __return_storage_ptr__;
}

Assistant:

Interpreter::Value Interpreter::ProcessStart(const Expression &aExpr)
{
    Value              value;
    CommissionerAppPtr commissioner = nullptr;
    Expression         expr         = aExpr;
    BorderRouter       br;

    switch (aExpr.size())
    {
    case 1:
    {
        // starting currently selected network
        uint64_t       nid;
        RegistryStatus status = mRegistry->GetCurrentNetworkXpan(nid);
        VerifyOrExit(status == RegistryStatus::kSuccess,
                     value = ERROR_REGISTRY_ERROR("getting selected network failed"));
        SuccessOrExit(value = mJobManager->GetSelectedCommissioner(commissioner));
        SuccessOrExit(value = mJobManager->MakeBorderRouterChoice(nid, br));
        expr.push_back(br.mAgent.mAddr);
        expr.push_back(std::to_string(br.mAgent.mPort));
        break;
    }
    case 2:
    {
        // starting newtork by br raw id (experimental, for dev tests only)
        persistent_storage::BorderRouterId rawid;
        NetworkSelectionComparator         guard(*this);

        SuccessOrExit(value = ParseInteger(rawid.mId, expr[1]));
        VerifyOrExit(mRegistry->GetBorderRouter(rawid, br) == RegistryStatus::kSuccess,
                     value = ERROR_NOT_FOUND("br[{}] not found", rawid.mId));
        VerifyOrExit(mRegistry->SetCurrentNetwork(br) == RegistryStatus::kSuccess,
                     value = ERROR_NOT_FOUND("network selection failed for nwk[{}]", br.mNetworkId.mId));
        SuccessOrExit(UpdateNetworkSelectionInfo());
        SuccessOrExit(value = mJobManager->GetSelectedCommissioner(commissioner));
        expr.pop_back();
        expr.push_back(br.mAgent.mAddr);
        expr.push_back(std::to_string(br.mAgent.mPort));
        break;
    }
    case 3:
    {
        NetworkSelectionComparator guard(*this);

        // starting network with explicit br_addr and br_port
        VerifyOrExit(mRegistry->ForgetCurrentNetwork() == RegistryStatus::kSuccess,
                     value = ERROR_REGISTRY_ERROR("failed to drop network selection"));
        SuccessOrExit(UpdateNetworkSelectionInfo());
        SuccessOrExit(value = mJobManager->GetSelectedCommissioner(commissioner));
        break;
    }
    default:
        ExitNow(value = ERROR_INVALID_COMMAND(SYNTAX_MANY_ARGS));
    }

    value = ProcessStartJob(commissioner, expr);
exit:
    return value;
}